

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::GraphicsCacheTestInstance::verifyTestResult
          (TestStatus *__return_storage_ptr__,GraphicsCacheTestInstance *this)

{
  TestLog *log;
  bool bVar1;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *pAVar2;
  ConstPixelBufferAccess local_b8;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> resultCache;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> resultNoCache;
  ConstPixelBufferAccess local_70;
  UVec4 local_48;
  
  vk = Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  queueFamilyIndex =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_CacheTestInstance).super_TestInstance.m_context);
  queue = Context::getUniversalQueue((this->super_CacheTestInstance).super_TestInstance.m_context);
  pAVar2 = Context::getDefaultAllocator
                     ((this->super_CacheTestInstance).super_TestInstance.m_context);
  readColorAttachment(&resultNoCache,vk,device,queue,queueFamilyIndex,pAVar2,
                      (VkImage)this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                               m_data.object.m_internal,this->m_colorFormat,&this->m_renderSize);
  pAVar2 = Context::getDefaultAllocator
                     ((this->super_CacheTestInstance).super_TestInstance.m_context);
  readColorAttachment(&resultCache,vk,device,queue,queueFamilyIndex,pAVar2,
                      (VkImage)this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                               m_data.object.m_internal,this->m_colorFormat,&this->m_renderSize);
  log = ((this->super_CacheTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&local_b8,
             resultNoCache.
             super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr)
  ;
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&local_70,
             resultCache.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
             .m_data.ptr);
  local_48.m_data[0] = 1;
  local_48.m_data[1] = 1;
  local_48.m_data[2] = 1;
  local_48.m_data[3] = 1;
  bVar1 = tcu::intThresholdCompare
                    (log,"IntImageCompare","Image comparison",&local_b8,&local_70,&local_48,
                     COMPARE_LOG_RESULT);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Render images w/o cached pipeline match.",
               (allocator<char> *)&local_70);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&local_b8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Render Images mismatch.",(allocator<char> *)&local_70);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_b8);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~UniqueBase
            (&resultCache.
              super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~UniqueBase
            (&resultNoCache.
              super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus GraphicsCacheTestInstance::verifyTestResult (void)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();
	const deUint32          queueFamilyIndex = m_context.getUniversalQueueFamilyIndex();

	const VkQueue                   queue               = m_context.getUniversalQueue();
	de::MovePtr<tcu::TextureLevel>  resultNoCache       = readColorAttachment(vk,
																			  vkDevice,
																			  queue,
																			  queueFamilyIndex,
																			  m_context.getDefaultAllocator(),
																			  *m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE],
																			  m_colorFormat,
																			  m_renderSize);
	de::MovePtr<tcu::TextureLevel>  resultCache         = readColorAttachment(vk,
																			  vkDevice,
																			  queue,
																			  queueFamilyIndex,
																			  m_context.getDefaultAllocator(),
																			  *m_colorImage[PIPELINE_CACHE_NDX_CACHED],
																			  m_colorFormat,
																			  m_renderSize);

	bool compareOk = tcu::intThresholdCompare(m_context.getTestContext().getLog(),
											  "IntImageCompare",
											  "Image comparison",
											  resultNoCache->getAccess(),
											  resultCache->getAccess(),
											  tcu::UVec4(1, 1, 1, 1),
											  tcu::COMPARE_LOG_RESULT);

	if (compareOk)
		return tcu::TestStatus::pass("Render images w/o cached pipeline match.");
	else
		return tcu::TestStatus::fail("Render Images mismatch.");
}